

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void dec_build_inter_predictors
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,int plane,MB_MODE_INFO *mi,int build_for_obmc
               ,int bw,int bh,int mi_x,int mi_y)

{
  MB_MODE_INFO **ppMVar1;
  char cVar2;
  PREDICTION_MODE PVar3;
  byte bVar4;
  BLOCK_SIZE BVar5;
  byte bVar6;
  byte bVar7;
  MV_REFERENCE_FRAME ref_frame;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint8_t *puVar12;
  WarpedMotionParams *pWVar13;
  MB_MODE_INFO *pMVar14;
  scale_factors *psVar15;
  uint uVar16;
  buf_2d *pbVar17;
  char cVar18;
  int ref;
  int iVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  long lVar25;
  buf_2d *ref_buf;
  bool bVar26;
  long lVar27;
  int col;
  MB_MODE_INFO **ppMVar28;
  bool bVar29;
  bool bVar30;
  int local_1c0;
  WarpTypesAllowed warp_types;
  MV mv;
  int is_global [2];
  InterPredParams local_108;
  
  uVar22 = (ulong)mi->bsize;
  uVar8 = *(ushort *)&mi->field_0xa7;
  if ((uVar8 >> 7 & 1) == 0 && build_for_obmc == 0) {
    iVar9 = (dcb->xd).plane[plane].subsampling_x;
    iVar10 = (dcb->xd).plane[plane].subsampling_y;
    bVar20 = (byte)(0x10003L >> (mi->bsize & 0x3f));
    bVar24 = iVar9 != 0 & bVar20;
    bVar29 = (0x20005UL >> (uVar22 & 0x3f) & 1) != 0;
    bVar26 = iVar10 != 0 && bVar29;
    if ((bVar24 != 0) || (iVar10 != 0 && bVar29)) {
      lVar23 = (long)(dcb->xd).mi_stride;
      lVar27 = -(ulong)bVar26;
      ppMVar28 = (dcb->xd).mi + lVar23 * lVar27;
      do {
        lVar21 = -(ulong)bVar24;
        if (lVar27 == 1) {
          bVar29 = iVar10 != 0;
          bVar30 = iVar9 != 0;
          bVar24 = block_size_wide[uVar22];
          bVar4 = block_size_high[uVar22];
          BVar5 = av1_ss_size_lookup[uVar22][bVar30][bVar29];
          bVar6 = block_size_wide[BVar5];
          cVar2 = mi->ref_frame[1];
          bVar20 = bVar20 & bVar30;
          bVar7 = block_size_high[BVar5];
          local_1c0 = -(uint)bVar26;
          for (uVar16 = 0; uVar16 < bVar7; uVar16 = uVar16 + (bVar4 >> bVar29)) {
            lVar23 = -(ulong)bVar20;
            for (uVar22 = 0; uVar22 < bVar6; uVar22 = uVar22 + (bVar24 >> bVar30)) {
              pMVar14 = (dcb->xd).mi[(long)local_1c0 * (long)(dcb->xd).mi_stride + lVar23];
              iVar9 = (dcb->xd).plane[plane].dst.stride;
              puVar12 = (dcb->xd).plane[plane].dst.buf;
              ref_frame = pMVar14->ref_frame[0];
              get_ref_frame_buf(cm,ref_frame);
              psVar15 = get_ref_scale_factors_const(cm,ref_frame);
              is_global[0] = 0;
              is_global[1] = 0;
              warp_types.global_warp_allowed = pMVar14->mv[0].as_int;
              av1_init_inter_params
                        (&local_108,(uint)(bVar24 >> bVar30),(uint)(bVar4 >> bVar29),
                         ((int)(mi_y + (uint)bVar26 * -4) >> bVar29) + uVar16,
                         ((int)(mi_x + (uint)bVar20 * -4) >> bVar30) + (int)uVar22,
                         (dcb->xd).plane[plane].subsampling_x,(dcb->xd).plane[plane].subsampling_y,
                         (dcb->xd).bd,(uint)((dcb->xd).cur_buf)->flags >> 3 & 1,
                         *(ushort *)&mi->field_0xa7 >> 7 & 1,psVar15,(buf_2d *)is_global,
                         pMVar14->interp_filters);
              iVar10 = (dcb->xd).bd;
              local_108.conv_params.round_0 = iVar10 + -7;
              local_108.conv_params.round_1 = 0x15 - iVar10;
              if ('\0' < cVar2) {
                local_108.conv_params.round_1 = 7;
              }
              if (iVar10 < 0xb) {
                local_108.conv_params.round_0 = 3;
                local_108.conv_params.round_1 = (uint)(cVar2 < '\x01') * 4 + 7;
              }
              local_108.conv_params.do_average = 0;
              local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
              local_108.conv_params.dst_stride = 0;
              local_108.conv_params.use_dist_wtd_comp_avg = 0;
              local_108.conv_params.plane = plane;
              local_108.conv_params.is_compound = (uint)('\0' < cVar2);
              build_one_inter_predictor
                        (puVar12 + uVar22 + (long)(int)(iVar9 * uVar16),
                         (dcb->xd).plane[plane].dst.stride,(MV *)&warp_types,&local_108,&dcb->xd,
                         mi_x + (int)uVar22,mi_y + uVar16,0,dcb->mc_buf);
              lVar23 = lVar23 + 1;
            }
            local_1c0 = local_1c0 + 1;
          }
          return;
        }
        while (lVar21 != 1) {
          ppMVar1 = ppMVar28 + lVar21;
          if ((((*ppMVar1)->field_0xa7 & 0x80) != 0) ||
             (lVar21 = lVar21 + 1, (*ppMVar1)->ref_frame[0] < '\x01')) goto LAB_0016966d;
        }
        lVar27 = lVar27 + 1;
        ppMVar28 = ppMVar28 + lVar23;
      } while( true );
    }
  }
LAB_0016966d:
  lVar23 = (long)plane;
  cVar2 = mi->ref_frame[1];
  lVar27 = lVar23 * 0xa30;
  pbVar17 = &(dcb->xd).plane[lVar23].dst;
  puVar12 = pbVar17->buf;
  is_global[0] = 0;
  is_global[1] = 0;
  pWVar13 = (dcb->xd).global_motion;
  PVar3 = mi->mode;
  bVar20 = block_size_high[uVar22];
  if (block_size_wide[uVar22] < block_size_high[uVar22]) {
    bVar20 = block_size_wide[uVar22];
  }
  lVar25 = (ulong)('\0' < cVar2) + 1;
  for (lVar21 = 0; lVar25 != lVar21; lVar21 = lVar21 + 1) {
    is_global[lVar21] =
         (uint)((7 < bVar20 && (PVar3 - 0xf & 0xf7) == 0) &&
               1 < pWVar13[mi->ref_frame[lVar21]].wmtype);
  }
  iVar9 = (dcb->xd).plane[lVar23].subsampling_x;
  iVar10 = (dcb->xd).plane[lVar23].subsampling_y;
  for (lVar21 = 0; lVar25 != lVar21; lVar21 = lVar21 + 1) {
    cVar18 = (char)uVar8;
    psVar15 = &cm->sf_identity;
    if (-1 < cVar18) {
      psVar15 = (dcb->xd).block_ref_scale_factors[lVar21];
    }
    ref_buf = (buf_2d *)((long)&(dcb->xd).plane[0].pre[0].buf + lVar27);
    if (cVar18 < '\0') {
      ref_buf = pbVar17;
    }
    mv = *(MV *)(mi->mv + lVar21);
    warp_types.global_warp_allowed = is_global[lVar21];
    warp_types.local_warp_allowed = (int)(mi->motion_mode == '\x02');
    av1_init_inter_params
              (&local_108,bw,bh,
               (int)(mi_y + (uint)(((0x20005UL >> (uVar22 & 0x3f) & 1) != 0 && build_for_obmc == 0)
                                  && iVar10 != 0) * -4) >> ((byte)iVar10 & 0x1f),
               (int)(mi_x + (uint)(((0x10003UL >> (uVar22 & 0x3f) & 1) != 0 && build_for_obmc == 0)
                                  && iVar9 != 0) * -4) >> ((byte)iVar9 & 0x1f),
               (dcb->xd).plane[lVar23].subsampling_x,(dcb->xd).plane[lVar23].subsampling_y,
               (dcb->xd).bd,(uint)((dcb->xd).cur_buf)->flags >> 3 & 1,
               *(ushort *)&mi->field_0xa7 >> 7 & 1,psVar15,ref_buf,mi->interp_filters);
    iVar19 = 0xb;
    if ('\0' < cVar2) {
      local_108.comp_mode = UNIFORM_COMP;
      iVar19 = 7;
    }
    iVar11 = (dcb->xd).bd;
    local_108.conv_params.round_0 = iVar11 + -7;
    local_108.conv_params.round_1 = 0x15 - iVar11;
    if ('\0' < cVar2) {
      local_108.conv_params.round_1 = 7;
    }
    local_108.conv_params.dst = (dcb->xd).tmp_conv_dst;
    if (iVar11 < 0xb) {
      local_108.conv_params.round_0 = 3;
      local_108.conv_params.round_1 = iVar19;
    }
    iVar19 = (int)lVar21;
    local_108.conv_params.dst_stride = 0x80;
    local_108.conv_params.use_dist_wtd_comp_avg = 0;
    local_108.conv_params.do_average = iVar19;
    local_108.conv_params.plane = plane;
    local_108.conv_params.is_compound = (uint)('\0' < cVar2);
    av1_dist_wtd_comp_weight_assign
              (cm,mi,&local_108.conv_params.fwd_offset,&local_108.conv_params.bck_offset,
               &local_108.conv_params.use_dist_wtd_comp_avg,(uint)('\0' < cVar2));
    if (build_for_obmc == 0) {
      av1_init_warp_params(&local_108,&warp_types,iVar19,&dcb->xd,mi);
    }
    if (((mi->interinter_comp).type & 0xfe) == 2) {
      local_108.sb_type = mi->bsize;
      local_108.mask_comp.wedge_index = (mi->interinter_comp).wedge_index;
      local_108.mask_comp.wedge_sign = (mi->interinter_comp).wedge_sign;
      local_108.mask_comp.mask_type = (mi->interinter_comp).mask_type;
      local_108.mask_comp.type = (mi->interinter_comp).type;
      local_108.mask_comp._12_4_ = *(undefined4 *)&(mi->interinter_comp).field_0xc;
      if (lVar21 == 1) {
        local_108.conv_params.do_average = 0;
        local_108.comp_mode = MASK_COMP;
      }
      local_108.mask_comp.seg_mask = (dcb->xd).seg_mask;
    }
    build_one_inter_predictor
              (puVar12,(dcb->xd).plane[lVar23].dst.stride,&mv,&local_108,&dcb->xd,mi_x,mi_y,iVar19,
               dcb->mc_buf);
    lVar27 = lVar27 + 0x20;
  }
  return;
}

Assistant:

static void dec_build_inter_predictors(const AV1_COMMON *cm,
                                       DecoderCodingBlock *dcb, int plane,
                                       const MB_MODE_INFO *mi,
                                       int build_for_obmc, int bw, int bh,
                                       int mi_x, int mi_y) {
  build_inter_predictors(cm, &dcb->xd, plane, mi, build_for_obmc, bw, bh, mi_x,
                         mi_y, dcb->mc_buf);
}